

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O2

void duckdb::AssertMaxFileSize(string *file_name,idx_t file_size)

{
  string *fmt_str;
  InvalidInputException *this;
  idx_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  string error_msg;
  string file_byte_size_format;
  string max_byte_size_format;
  
  if (file_size >> 0x20 == 0) {
    return;
  }
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&max_byte_size_format,(StringUtil *)0xffffffff,0x400,in_RCX);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&file_byte_size_format,(StringUtil *)file_size,0x400,in_RCX);
  ::std::__cxx11::string::string
            (local_90,"File \'%s\' size (%s) exceeds maximum allowed file (%s)",&local_d1);
  fmt_str = (string *)(file_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::string(local_b0,(string *)&file_byte_size_format);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)&max_byte_size_format);
  StringUtil::Format<char_const*,std::__cxx11::string,std::__cxx11::string>
            (&error_msg,(StringUtil *)local_90,fmt_str,(char *)local_b0,&local_d0,in_R9);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string(local_b0);
  ::std::__cxx11::string::~string(local_90);
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,&error_msg);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void AssertMaxFileSize(const string &file_name, idx_t file_size) {
	const auto max_file_size = NumericLimits<uint32_t>::Maximum();
	if (file_size > max_file_size) {
		auto max_byte_size_format = StringUtil::BytesToHumanReadableString(max_file_size);
		auto file_byte_size_format = StringUtil::BytesToHumanReadableString(file_size);
		auto error_msg = StringUtil::Format("File '%s' size (%s) exceeds maximum allowed file (%s)", file_name.c_str(),
		                                    file_byte_size_format, max_byte_size_format);
		throw InvalidInputException(error_msg);
	}
}